

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall SPTest_VarStages_Test::TestBody(SPTest_VarStages_Test *this)

{
  StringRef name;
  bool bVar1;
  int iVar2;
  int iVar3;
  SPAdapter *message;
  int iVar4;
  int iVar5;
  Stage SVar6;
  AssertionResult gtest_ar_6;
  int i;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  SPAdapter sp;
  IntSuffixHandler stage;
  TestBasicProblem p;
  int in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  SPAdapter *in_stack_fffffffffffff780;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  undefined4 in_stack_fffffffffffff798;
  undefined4 uVar7;
  int in_stack_fffffffffffff79c;
  int line;
  char *in_stack_fffffffffffff7a0;
  Type in_stack_fffffffffffff7ac;
  Type type;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  Message *in_stack_fffffffffffff7f8;
  AssertHelper *in_stack_fffffffffffff800;
  AssertionResult local_790;
  int local_77c;
  SPAdapter *local_768;
  int local_760;
  SPAdapter *local_758;
  int local_750;
  int in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  TestBasicProblem *in_stack_fffffffffffff8c0;
  ColProblem *in_stack_fffffffffffff8d8;
  SPAdapter *in_stack_fffffffffffff8e0;
  AssertionResult local_6f8 [2];
  SPAdapter *local_6d8;
  int local_6d0;
  SPAdapter *local_6c8;
  int local_6c0;
  int local_6b8;
  undefined4 local_6b4;
  AssertionResult local_6b0 [2];
  int local_690;
  undefined4 local_68c;
  AssertionResult local_688 [2];
  int local_668;
  undefined4 local_664;
  AssertionResult local_660 [2];
  int local_640;
  undefined4 local_63c;
  AssertionResult local_638;
  SPAdapter local_628;
  SuffixBase local_3c0;
  
  TestBasicProblem::TestBasicProblem
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  name.data_._4_4_ = in_stack_fffffffffffff794;
  name.data_._0_4_ = in_stack_fffffffffffff790;
  name.size_._0_4_ = in_stack_fffffffffffff798;
  name.size_._4_4_ = in_stack_fffffffffffff79c;
  local_3c0.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::AddIntSuffix
                         ((BasicProblem<mp::BasicProblemParams<int>_> *)
                          CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),name,
                          (int)((ulong)in_stack_fffffffffffff780 >> 0x20),
                          (int)in_stack_fffffffffffff780);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SuffixHandler<int>::SetValue
            ((SuffixHandler<int> *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
             in_stack_fffffffffffff778);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SuffixHandler<int>::SetValue
            ((SuffixHandler<int> *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
             in_stack_fffffffffffff778);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SuffixHandler<int>::SetValue
            ((SuffixHandler<int> *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
             in_stack_fffffffffffff778);
  mp::SPAdapter::SPAdapter(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  local_63c = 6;
  local_640 = mp::SPAdapter::num_vars((SPAdapter *)0x11adef);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (int *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
             (int *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_638);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x11aec2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0x11af25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11af7d);
  local_664 = 0;
  local_668 = mp::SPAdapter::num_cons((SPAdapter *)0x11af95);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (int *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
             (int *)in_stack_fffffffffffff780,
             (type *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_660);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x11b04d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0x11b0b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b108);
  local_68c = 3;
  local_690 = mp::SPAdapter::num_stages(&local_628);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (int *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
             (int *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_688);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    in_stack_fffffffffffff800 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11b1d3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0x11b236);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b28e);
  local_6b4 = 3;
  SVar6 = mp::SPAdapter::stage(in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  message = SVar6.adapter_;
  local_6d0 = SVar6.index_;
  local_6d8 = message;
  local_6c8 = message;
  local_6c0 = local_6d0;
  local_6b8 = mp::SPAdapter::Stage::num_vars((Stage *)0x11b2fc);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (int *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
             (int *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x11b3a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff800,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0x11b400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b458);
  mp::SPAdapter::stage(in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  mp::SPAdapter::Stage::num_vars((Stage *)0x11b4c3);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (int *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
             (int *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6f8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x11b56a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff800,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0x11b5c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b61f);
  SVar6 = mp::SPAdapter::stage(in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  local_768 = SVar6.adapter_;
  iVar4 = SVar6.index_;
  local_760 = iVar4;
  local_758 = local_768;
  local_750 = iVar4;
  iVar2 = mp::SPAdapter::Stage::num_vars((Stage *)0x11b68a);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (int *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
             (int *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffff8c0);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7ac);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar4,iVar2));
    in_stack_fffffffffffff7a0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x11b731);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar4,iVar2),type,in_stack_fffffffffffff7a0,
               in_stack_fffffffffffff79c,
               (char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff800,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0x11b78e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b7e6);
  for (local_77c = 0; local_77c < 3; local_77c = local_77c + 1) {
    SVar6 = mp::SPAdapter::stage(in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
    iVar5 = SVar6.index_;
    uVar7 = SVar6.adapter_._0_4_;
    line = SVar6.adapter_._4_4_;
    iVar3 = mp::SPAdapter::Stage::num_cons((Stage *)0x11b86c);
    testing::internal::EqHelper<true>::Compare<int,int>
              ((char *)CONCAT44(line,uVar7),(char *)CONCAT44(iVar5,iVar3),
               (int *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
               (int *)in_stack_fffffffffffff780,
               (type *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
    in_stack_fffffffffffff78f = testing::AssertionResult::operator_cast_to_bool(&local_790);
    if (!(bool)in_stack_fffffffffffff78f) {
      testing::Message::Message((Message *)CONCAT44(iVar4,iVar2));
      in_stack_fffffffffffff780 =
           (SPAdapter *)testing::AssertionResult::failure_message((AssertionResult *)0x11b918);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(iVar4,iVar2),type,in_stack_fffffffffffff7a0,line,
                 (char *)CONCAT44(iVar5,iVar3));
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffff800,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
      testing::Message::~Message((Message *)0x11b975);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b9ca);
  }
  mp::SPAdapter::~SPAdapter(in_stack_fffffffffffff780);
  TestBasicProblem::~TestBasicProblem((TestBasicProblem *)0x11ba09);
  return;
}

Assistant:

TEST(SPTest, VarStages) {
  TestBasicProblem p(6);
  auto stage = p.AddIntSuffix("stage", mp::suf::VAR, 3);
  stage.SetValue(0, 3);
  stage.SetValue(1, 2);
  stage.SetValue(2, 3);
  mp::SPAdapter sp(p);
  EXPECT_EQ(6, sp.num_vars());
  EXPECT_EQ(0, sp.num_cons());
  EXPECT_EQ(3, sp.num_stages());
  EXPECT_EQ(3, sp.stage(0).num_vars());
  EXPECT_EQ(1, sp.stage(1).num_vars());
  EXPECT_EQ(2, sp.stage(2).num_vars());
  for (int i = 0; i < 3; ++i)
    EXPECT_EQ(0, sp.stage(i).num_cons());
}